

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::enforceNoDuplicateTestCases
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions)

{
  size_t this;
  bool bVar1;
  ReusableStringStream *pRVar2;
  pointer this_00;
  TestCaseInfo *pTVar3;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar4;
  ReusableStringStream local_c8;
  string local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  _Rb_tree_const_iterator<Catch::TestCase> local_70;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> prev;
  TestCase *function;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> seenFunctions;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions_local;
  
  seenFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)functions;
  clara::std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
  set((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
      &__range1);
  this = seenFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                      seenFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  function = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                *)&function);
    if (!bVar1) {
      clara::std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
      ::~set((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             &__range1);
      return;
    }
    prev._8_8_ = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator*(&__end1);
    pVar4 = clara::std::
            set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
            insert((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                    *)&__range1,(value_type *)prev._8_8_);
    local_90 = (_Base_ptr)pVar4.first._M_node;
    local_88 = pVar4.second;
    local_70._M_node = local_90;
    prev.first._M_node._0_1_ = local_88;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&__end1);
  }
  ReusableStringStream::ReusableStringStream(&local_c8);
  pRVar2 = ReusableStringStream::operator<<(&local_c8,(char (*) [20])"error: TEST_CASE( \"");
  pRVar2 = ReusableStringStream::operator<<
                     (pRVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             prev._8_8_);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [22])"\" ) already defined.\n");
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [16])"\tFirst seen at ");
  this_00 = clara::std::_Rb_tree_const_iterator<Catch::TestCase>::operator->(&local_70);
  pTVar3 = TestCase::getTestCaseInfo(this_00);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,&pTVar3->lineInfo);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [2])0x211da5);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [15])"\tRedefined at ");
  pTVar3 = TestCase::getTestCaseInfo((TestCase *)prev._8_8_);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,&pTVar3->lineInfo);
  ReusableStringStream::str_abi_cxx11_(&local_b0,pRVar2);
  throw_domain_error(&local_b0);
}

Assistant:

void enforceNoDuplicateTestCases( std::vector<TestCase> const& functions ) {
        std::set<TestCase> seenFunctions;
        for( auto const& function : functions ) {
            auto prev = seenFunctions.insert( function );
            CATCH_ENFORCE( prev.second,
                    "error: TEST_CASE( \"" << function.name << "\" ) already defined.\n"
                    << "\tFirst seen at " << prev.first->getTestCaseInfo().lineInfo << "\n"
                    << "\tRedefined at " << function.getTestCaseInfo().lineInfo );
        }
    }